

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t handle_inter_mode(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,BLOCK_SIZE bsize,
                         RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,
                         HandleInterModeArgs *args,int64_t ref_best_rd,uint8_t *tmp_buf,
                         CompoundTypeRdBuffers *rd_buffers,int64_t *best_est_rd,int do_tx_search,
                         InterModesInfo *inter_modes_info,motion_mode_candidate *motion_mode_cand,
                         int64_t *skip_rd,PruneInfoFromTpl *inter_cost_info_from_tpl,int64_t *yrd)

{
  BUFFER_SET dst;
  BUFFER_SET dst_00;
  BUFFER_SET dst_01;
  BUFFER_SET dst_02;
  _Bool _Var1;
  char cVar2;
  byte bVar3;
  THR_MODES TVar4;
  int iVar5;
  long lVar6;
  byte in_CL;
  CANDIDATE_MV in_RDX;
  CANDIDATE_MV unaff_RBP;
  CANDIDATE_MV in_RDI;
  CANDIDATE_MV in_R8;
  CANDIDATE_MV in_R9;
  RD_STATS *unaff_retaddr;
  undefined7 in_stack_00000008;
  BLOCK_SIZE in_stack_0000000f;
  MACROBLOCK *in_stack_00000010;
  TileDataEnc *in_stack_00000018;
  AV1_COMP *in_stack_00000020;
  undefined8 in_stack_00000028;
  MACROBLOCKD *in_stack_00000030;
  uint in_stack_00000038;
  AV1_COMMON *in_stack_00000040;
  HandleInterModeArgs *in_stack_00000048;
  MACROBLOCKD *in_stack_00000050;
  int64_t *in_stack_00000058;
  int *in_stack_00000060;
  BUFFER_SET *in_stack_00000068;
  int64_t *in_stack_00000070;
  int in_stack_00000078;
  InterModesInfo *in_stack_00000080;
  int in_stack_00000088;
  int64_t *in_stack_00000090;
  THR_MODES mode_enum;
  int64_t tmp_rd;
  int64_t this_yrd;
  int rate2_nocoeff;
  int64_t mrd;
  int mode1;
  int mode0;
  int not_best_mode;
  int mi_col;
  int mi_row;
  int skip_build_pred;
  double scale_factor [3] [11];
  int pix_idx;
  int th_idx;
  uint this_sse;
  MV_REFERENCE_FRAME ref;
  int skip_repeated_ref_mv;
  int_mv cur_mv [2];
  int compmode_interinter_cost;
  int rs;
  int drl_cost;
  int ref_mv_idx;
  int base_rate;
  int ref_mv_cost;
  ModeCosts *mode_costs;
  int16_t mode_ctx;
  int idx_mask;
  int best_ref_mv_idx;
  int_mv save_mv [2] [2];
  int ref_set;
  int ref_match_found_in_left_nb;
  int ref_match_found_in_above_nb;
  inter_mode_info mode_info [3];
  int64_t newmv_ret_val;
  int best_xskip_txfm;
  MB_MODE_INFO best_mbmi;
  int64_t best_yrd;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  int64_t best_rd;
  RD_STATS best_rd_stats_uv;
  RD_STATS best_rd_stats_y;
  RD_STATS best_rd_stats;
  int8_t ref_frame_type;
  int64_t ret_val;
  BUFFER_SET tmp_dst;
  BUFFER_SET orig_dst;
  macroblockd_plane *pd;
  int64_t rd;
  int rate_mv;
  int refs [2];
  int i;
  int prune_modes_based_on_tpl;
  TplParams *tpl_data;
  PREDICTION_MODE this_mode;
  int is_comp_pred;
  TxfmSearchInfo *txfm_info;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2dc;
  int16_t in_stack_fffffffffffff2e4;
  undefined1 in_stack_fffffffffffff2e6;
  PREDICTION_MODE in_stack_fffffffffffff2e7;
  undefined4 in_stack_fffffffffffff2e8;
  int_mv iVar7;
  int_mv iVar8;
  undefined4 in_stack_fffffffffffff2ec;
  MB_MODE_INFO *mbmi_00;
  int_mv iVar9;
  int_mv iVar10;
  MB_MODE_INFO_EXT *in_stack_fffffffffffff2f0;
  undefined4 in_stack_fffffffffffff2f8;
  undefined4 in_stack_fffffffffffff2fc;
  int_mv *mbmi_01;
  CANDIDATE_MV in_stack_fffffffffffff300;
  MACROBLOCKD *in_stack_fffffffffffff308;
  MACROBLOCK *in_stack_fffffffffffff310;
  AV1_COMMON *in_stack_fffffffffffff318;
  int in_stack_fffffffffffff320;
  int in_stack_fffffffffffff324;
  int_mv *in_stack_fffffffffffff328;
  AV1_COMMON *in_stack_fffffffffffff330;
  int_mv *in_stack_fffffffffffff338;
  CANDIDATE_MV in_stack_fffffffffffff340;
  CANDIDATE_MV in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff350;
  uint in_stack_fffffffffffff354;
  uint uVar11;
  uint in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff35c;
  int_mv *in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff368;
  undefined4 uVar12;
  int_mv iVar13;
  int_mv *x_00;
  undefined6 in_stack_fffffffffffff378;
  undefined1 uVar14;
  undefined1 in_stack_fffffffffffff37f;
  TileDataEnc *in_stack_fffffffffffff380;
  int *in_stack_fffffffffffff388;
  int in_stack_fffffffffffff390;
  int in_stack_fffffffffffff394;
  int_mv *in_stack_fffffffffffff398;
  uint in_stack_fffffffffffff3a0;
  uint in_stack_fffffffffffff3a4;
  int in_stack_fffffffffffff3a8;
  uint in_stack_fffffffffffff3ac;
  uint uVar15;
  AV1_COMP *in_stack_fffffffffffff3b8;
  inter_mode_info *in_stack_fffffffffffff3c0;
  BUFFER_SET *in_stack_fffffffffffff3f8;
  BUFFER_SET *in_stack_fffffffffffff400;
  undefined7 in_stack_fffffffffffff408;
  BLOCK_SIZE in_stack_fffffffffffff40f;
  TileDataEnc *in_stack_fffffffffffff410;
  AV1_COMP *in_stack_fffffffffffff418;
  MACROBLOCK *in_stack_fffffffffffff420;
  RD_STATS *in_stack_fffffffffffff428;
  int64_t *in_stack_fffffffffffff430;
  int *in_stack_fffffffffffff438;
  int64_t *in_stack_fffffffffffff460;
  int *in_stack_fffffffffffff468;
  int *in_stack_fffffffffffff470;
  HandleInterModeArgs *in_stack_fffffffffffff478;
  int64_t in_stack_fffffffffffff480;
  int_mv local_b20 [2];
  int local_b18;
  undefined4 local_b14;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  long local_b00;
  int16_t local_af2;
  int local_af0;
  int local_aec;
  undefined4 local_ae8 [5];
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac8 [18];
  int64_t local_a80;
  uint local_a74;
  undefined1 local_a70 [176];
  int *local_9c0;
  undefined1 local_9b8 [1024];
  undefined1 local_5b8 [1032];
  TileDataEnc *local_1b0;
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [47];
  int8_t local_129;
  int64_t local_128;
  undefined1 local_120 [48];
  CANDIDATE_MV CStack_f0;
  CANDIDATE_MV local_e8;
  int_mv iStack_e0;
  int_mv iStack_dc;
  int_mv local_d8;
  int_mv iStack_d4;
  CANDIDATE_MV local_d0;
  CANDIDATE_MV local_c8;
  int_mv local_bc;
  int_mv local_b8;
  int_mv local_b4;
  int_mv local_b0;
  int_mv local_ac;
  CANDIDATE_MV local_a8;
  undefined1 local_9d;
  int_mv local_9c;
  CANDIDATE_MV local_98;
  CANDIDATE_MV local_90;
  CANDIDATE_MV local_88;
  CANDIDATE_MV local_80;
  int_mv local_74;
  CANDIDATE_MV local_70;
  CANDIDATE_MV local_68;
  CANDIDATE_MV local_60;
  undefined1 local_51;
  CANDIDATE_MV local_50;
  CANDIDATE_MV local_40;
  CANDIDATE_MV local_38;
  
  local_70 = (CANDIDATE_MV)((long)in_RDI + 0x3bf80);
  local_68 = in_R9;
  local_60 = in_R8;
  local_51 = in_CL;
  local_50 = in_RDX;
  local_40 = in_RDI;
  local_74.as_int = av1_num_planes((AV1_COMMON *)local_70);
  local_80 = (CANDIDATE_MV)((long)local_50 + 0x1a0);
  local_88 = **(CANDIDATE_MV **)((long)local_50 + 0x2058);
  local_90 = (CANDIDATE_MV)((long)local_50 + 0x3c70);
  local_98 = (CANDIDATE_MV)((long)local_50 + 0x24e08);
  local_9c.as_int = has_second_ref((MB_MODE_INFO *)local_88);
  local_9d = *(PREDICTION_MODE *)((long)local_88 + 2);
  local_a8 = (CANDIDATE_MV)(*(long *)local_40 + 0xd2a8);
  uVar14 = false;
  if (*(int *)((long)local_40 + 0x60b0c) != 0) {
    iVar5 = av1_tpl_stats_ready((TplParams *)local_a8,(uint)*(byte *)((long)local_40 + 0x712c0));
    uVar14 = iVar5 != 0;
  }
  local_ac.as_int._1_3_ = 0;
  local_ac.as_int._0_1_ = uVar14;
  local_b8 = (int_mv)(int)*(MV_REFERENCE_FRAME *)((long)local_88 + 0x10);
  x_00 = &local_b4;
  if (*(MV_REFERENCE_FRAME *)((long)local_88 + 0x11) < '\0') {
    iVar13.as_int = 0;
  }
  else {
    iVar13 = (int_mv)(int)*(MV_REFERENCE_FRAME *)((long)local_88 + 0x11);
  }
  local_bc.as_int = 0;
  local_c8.this_mv = (int_mv)0xffffffff;
  local_c8.comp_mv = (int_mv)0x7fffffff;
  local_d0 = (CANDIDATE_MV)((long)local_80 + 0x10);
  local_120._40_8_ = *(CANDIDATE_MV *)((long)local_80 + 0x20);
  CStack_f0.this_mv = (int_mv)((RD_STATS *)((long)local_80 + 0xa50))->rate;
  CStack_f0.comp_mv = (int_mv)((RD_STATS *)((long)local_80 + 0xa50))->zero_rate;
  local_e8 = *(CANDIDATE_MV *)((long)local_80 + 0x1480);
  iStack_e0 = *(int_mv *)((long)local_80 + 0x38);
  iStack_dc = *(int_mv *)((long)local_80 + 0xa68);
  local_d8 = *(int_mv *)((long)local_80 + 0x1498);
  local_120._8_8_ = (in_stack_00000020->enc_quant_dequant_params).quants.y_round + 0xff;
  local_120._16_8_ = (in_stack_00000020->enc_quant_dequant_params).quants.y_round_fp + 0xff;
  local_120._24_4_ = 0x80;
  local_120._28_4_ = 0x80;
  local_120._32_4_ = 0x80;
  local_128 = 0x7fffffffffffffff;
  local_b4 = iVar13;
  local_129 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                                 CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8));
  local_1b0 = (TileDataEnc *)0x7fffffffffffffff;
  local_9c0 = (int *)0x7fffffffffffffff;
  memcpy(local_a70,(void *)local_88,0xb0);
  local_a74 = 0;
  local_a80 = 0x7fffffffffffffff;
  local_acc = 0;
  local_ad0 = 0;
  if (local_ac.as_int != 0) {
    local_acc = find_ref_match_in_above_nbs
                          ((int)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
    local_ad0 = find_ref_match_in_left_nbs((int)in_stack_fffffffffffff310,in_stack_fffffffffffff308)
    ;
  }
  local_ad4 = get_drl_refmv_count(in_stack_fffffffffffff310,
                                  (MV_REFERENCE_FRAME *)in_stack_fffffffffffff308,
                                  in_stack_fffffffffffff300.comp_mv._3_1_);
  local_aec = -1;
  local_af0 = ref_mv_idx_to_search
                        ((AV1_COMP *)
                         CONCAT17(in_stack_fffffffffffff37f,
                                  CONCAT16(uVar14,in_stack_fffffffffffff378)),
                         (MACROBLOCK *)&x_00->as_mv,
                         (RD_STATS *)CONCAT44(iVar13.as_int,in_stack_fffffffffffff368),
                         (HandleInterModeArgs *)&in_stack_fffffffffffff360->as_mv,
                         CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                         (BLOCK_SIZE)(in_stack_fffffffffffff354 >> 0x18),in_stack_fffffffffffff390);
  local_af2 = av1_mode_context_analyzer
                        ((int16_t *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8),
                         (MV_REFERENCE_FRAME *)in_stack_fffffffffffff2f0);
  local_b00 = (long)local_50 + 0x4230;
  local_b04 = cost_mv_ref((ModeCosts *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8)
                          ,in_stack_fffffffffffff2e7,in_stack_fffffffffffff2e4);
  mbmi_01 = (int_mv *)CONCAT44(in_stack_fffffffffffff2fc,in_stack_fffffffffffff2f8);
  mbmi_00 = (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8);
  local_b08 = *(int *)&in_stack_00000010->plane[0].quant_shift_QTX +
              *(int *)((long)&in_stack_00000010->plane[0].quant_shift_QTX + 4) + local_b04;
  for (local_b0.as_int = 0; (int)local_b0.as_int < 2; local_b0.as_int = local_b0.as_int + 1) {
    local_ae8[(long)(int)local_b0.as_int * 2] = 0x80008000;
    local_ae8[(long)(int)local_b0.as_int * 2 + 1] = 0x80008000;
  }
  *(undefined4 *)((long)(in_stack_00000010->e_mbd).plane[1].seg_qmatrix[5] + 0x5c) = 0;
  local_b0c = 0;
  do {
    if (local_ad4 <= local_b0c) {
      if (local_1b0 == (TileDataEnc *)0x7fffffffffffffff) {
        local_38.this_mv = (int_mv)0xffffffff;
        local_38.comp_mv = (int_mv)0x7fffffff;
      }
      else {
        memcpy((void *)local_60,local_158,0x28);
        memcpy((void *)local_68,local_180,0x28);
        memcpy((void *)CONCAT17(in_stack_0000000f,in_stack_00000008),local_1a8,0x28);
        *(int **)in_stack_00000060 = local_9c0;
        memcpy((void *)local_88,local_a70,0xb0);
        *(byte *)local_98 = (byte)local_a74;
        memcpy((byte *)((long)local_98 + 1),local_5b8,
               (ulong)*(uint8_t *)((long)local_80 + 0x2075) *
               (ulong)*(uint8_t *)((long)local_80 + 0x2074));
        memcpy(*(uint8_t **)((long)local_80 + 0x1ee8),local_9b8,
               (long)(int)((uint)*(uint8_t *)((long)local_80 + 0x2075) *
                          (uint)*(uint8_t *)((long)local_80 + 0x2074)));
        *(long *)((long)local_60 + 0x10) =
             ((long)*(int *)local_60 * (long)*(int *)((long)local_50 + 0x4218) + 0x100 >> 9) +
             *(int64_t *)((long)local_60 + 8) * 0x80;
        local_38 = *(CANDIDATE_MV *)((long)local_60 + 0x10);
      }
      return (int64_t)local_38;
    }
    *(ushort *)((long)local_88 + 0xa7) =
         *(ushort *)((long)local_88 + 0xa7) & 0xffcf | ((byte)local_b0c & 3) << 4;
    local_ac8[(long)local_b0c * 5 + 1] = -0x7fff8000;
    local_ac8[(long)local_b0c * 5 + 3] = 0x7fffffff;
    local_b10 = get_drl_cost((MB_MODE_INFO *)&mbmi_01->as_mv,in_stack_fffffffffffff2f0,
                             (int (*) [2])mbmi_00,in_stack_fffffffffffff2e7);
    local_ac8[(long)local_b0c * 5] = local_b10;
    local_ac8[(long)local_b0c * 5 + 4] = 0;
    _Var1 = mask_check_bit(local_af0,local_b0c);
    if ((_Var1) &&
       ((((local_ac.as_int == 0 || (local_acc != 0)) || (local_ad0 != 0)) ||
        ((in_stack_00000018 == (TileDataEnc *)0x7fffffffffffffff ||
         (iVar5 = prune_modes_based_on_tpl_stats
                            ((PruneInfoFromTpl *)&in_stack_fffffffffffff338->as_mv,
                             (int *)in_stack_fffffffffffff330,
                             (int)((ulong)in_stack_fffffffffffff328 >> 0x20),
                             (PREDICTION_MODE)((ulong)in_stack_fffffffffffff328 >> 0x18),
                             in_stack_fffffffffffff324), iVar5 == 0)))))) {
      av1_init_rd_stats((RD_STATS *)local_60);
      *(COMPOUND_TYPE *)((long)local_88 + 0x53) = '\0';
      *(ushort *)((long)local_88 + 0xa7) = *(ushort *)((long)local_88 + 0xa7) & 0xfeff;
      *(ushort *)((long)local_88 + 0xa7) = *(ushort *)((long)local_88 + 0xa7) & 0xfdff | 0x200;
      if (*(MV_REFERENCE_FRAME *)((long)local_88 + 0x11) == '\0') {
        *(MV_REFERENCE_FRAME *)((long)local_88 + 0x11) = -1;
      }
      *(uint8_t *)((long)local_88 + 0x19) = '\0';
      *(MOTION_MODE *)((long)local_88 + 0x18) = '\0';
      *(int *)local_60 = local_b08;
      *(int *)local_60 = local_b10 + *(int *)local_60;
      local_b14 = 0;
      local_b18 = 0;
      if (local_9c.as_int == 0) {
        uVar12 = *(undefined4 *)((long)local_40 + 0x60aa8);
      }
      else {
        uVar12 = 0;
      }
      iVar5 = build_cur_mv(in_stack_fffffffffffff328,
                           (PREDICTION_MODE)((uint)in_stack_fffffffffffff324 >> 0x18),
                           in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                           (int)((ulong)in_stack_fffffffffffff308 >> 0x20));
      if (iVar5 != 0) {
        iVar5 = have_newmv_in_inter_mode(local_9d);
        if (iVar5 != 0) {
          local_a80 = handle_newmv((AV1_COMP *)
                                   CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),
                                   (MACROBLOCK *)
                                   CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0),
                                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffff398 >> 0x38),
                                   (int_mv *)
                                   CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
                                   in_stack_fffffffffffff388,
                                   (HandleInterModeArgs *)in_stack_fffffffffffff380,
                                   in_stack_fffffffffffff3c0);
          if (local_a80 != 0) goto LAB_002cb9a1;
          iVar5 = is_inter_singleref_mode(local_9d);
          if ((iVar5 != 0) && (local_b20[0].as_int != 0x80008000)) {
            cVar2 = (char)local_b8.as_mv.row;
            uVar11 = *(uint *)((long)local_50 + 0x25660 + (long)cVar2 * 4);
            if (uVar11 < *(uint *)((long)(in_stack_00000010->e_mbd).plane[1].seg_qmatrix[6] +
                                  (long)cVar2 * 4 + 0x4c)) {
              *(uint *)((long)(in_stack_00000010->e_mbd).plane[1].seg_qmatrix[6] +
                       (long)cVar2 * 4 + 0x4c) = uVar11;
            }
            if ((*(int *)((long)local_40 + 0x60d6c) != 0) &&
               (iVar5 = *(int *)((long)local_40 + 0x60d6c),
               bVar3 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[(byte)local_51],
               memcpy(&stack0xfffffffffffff3b8,&DAT_00ba5b50,0x108),
               (double)*(uint *)((long)(in_stack_00000010->e_mbd).plane[1].seg_qmatrix[6] + 0x6c) <
               *(double *)
                (&stack0xfffffffffffff3b8 + (long)(int)(bVar3 - 4) * 8 + (long)(iVar5 + -1) * 0x58)
               * (double)uVar11)) goto LAB_002cb9a1;
          }
          *(uint32_t *)local_60 = local_bc.as_int + *(int *)local_60;
        }
        for (local_b0.as_int = 0; (int)local_b0.as_int < (int)(local_9c.as_int + 1);
            local_b0.as_int = local_b0.as_int + 1) {
          ((int_mv *)((long)local_88 + 8))[(int)local_b0.as_int] = local_b20[(int)local_b0.as_int];
        }
        if ((((((long)*(int *)local_60 * (long)*(int *)((long)local_50 + 0x4218) + 0x100 >> 9 <=
                (long)in_stack_00000018) || (*(PREDICTION_MODE *)((long)local_88 + 2) == '\r')) ||
             (*(PREDICTION_MODE *)((long)local_88 + 2) == '\x11')) &&
            (((*(int *)((long)local_40 + 0x60ad8) == 0 || (local_9c.as_int == 0)) ||
             (iVar5 = prune_ref_mv_idx_search
                                (in_stack_fffffffffffff300.this_mv.as_int,
                                 (int)((ulong)mbmi_01 >> 0x20),
                                 (int_mv (*) [2])in_stack_fffffffffffff2f0,mbmi_00,
                                 CONCAT13(in_stack_fffffffffffff2e7,
                                          CONCAT12(in_stack_fffffffffffff2e6,
                                                   in_stack_fffffffffffff2e4))), iVar5 == 0)))) &&
           (((*(int *)((long)local_40 + 0x60938) == 0 || ((local_9d != 0xf && (local_9d != 0x17))))
            || (iVar5 = prune_zero_mv_with_sse
                                  ((aom_variance_fn_ptr_t *)CONCAT44(iVar13.as_int,uVar12),
                                   (MACROBLOCK *)&in_stack_fffffffffffff360->as_mv,
                                   (BLOCK_SIZE)((uint)in_stack_fffffffffffff35c >> 0x18),
                                   (HandleInterModeArgs *)
                                   CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                                   in_stack_fffffffffffff348.comp_mv.as_int), iVar5 == 0)))) {
          iVar5 = 0;
          uVar11 = *(uint *)local_80;
          in_stack_fffffffffffff3ac = *(int *)((long)local_80 + 4);
          if (local_9c.as_int != 0) {
            mbmi_00 = (MB_MODE_INFO *)(local_120 + 0x28);
            in_stack_fffffffffffff2f0 = (MB_MODE_INFO_EXT *)local_120;
            mbmi_01 = &local_bc;
            in_stack_fffffffffffff310 = (MACROBLOCK *)&stack0xfffffffffffff3b4;
            in_stack_fffffffffffff2e4 = (int16_t)((ulong)in_stack_00000028 >> 0x20);
            in_stack_fffffffffffff2e6 = (undefined1)((ulong)in_stack_00000028 >> 0x30);
            in_stack_fffffffffffff2e7 = (PREDICTION_MODE)((ulong)in_stack_00000028 >> 0x38);
            in_stack_fffffffffffff300 = local_60;
            in_stack_fffffffffffff308 = in_stack_00000050;
            in_stack_fffffffffffff3a8 =
                 process_compound_inter_mode
                           (in_stack_fffffffffffff3b8,(MACROBLOCK *)(ulong)uVar11,
                            (HandleInterModeArgs *)
                            CONCAT44(in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8),
                            CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0),
                            in_stack_fffffffffffff398,
                            (BLOCK_SIZE)((uint)in_stack_fffffffffffff394 >> 0x18),
                            (int *)in_stack_fffffffffffff400,
                            (CompoundTypeRdBuffers *)
                            CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                            (BUFFER_SET *)in_stack_fffffffffffff410,
                            (BUFFER_SET *)in_stack_fffffffffffff418,(int *)in_stack_fffffffffffff420
                            ,in_stack_fffffffffffff428,in_stack_fffffffffffff430,
                            in_stack_fffffffffffff438);
            if (in_stack_fffffffffffff3a8 != 0) goto LAB_002cb9a1;
          }
          if (((ulong)in_stack_00000010->plane[0].dequant_QTX & 0x100000000) != 0)
          goto LAB_002cb518;
          local_128 = av1_interpolation_filter_search
                                (in_stack_fffffffffffff420,in_stack_fffffffffffff418,
                                 in_stack_fffffffffffff410,in_stack_fffffffffffff40f,
                                 in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                                 in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                 in_stack_fffffffffffff470,in_stack_fffffffffffff478,
                                 in_stack_fffffffffffff480);
          if ((in_stack_00000010->plane[0].round_QTX != (int16_t *)0x0) && (local_9c.as_int == 0)) {
            *(CANDIDATE_MV *)
             (in_stack_00000010->plane[0].round_QTX +
             (ulong)(byte)local_9d * 0x60 + (long)local_b0c * 0x20 + (long)(int)local_b8.as_int * 4)
                 = local_c8;
          }
          iVar7 = local_e8.this_mv;
          iVar9 = local_e8.comp_mv;
          in_stack_fffffffffffff2e6 = CStack_f0.comp_mv._2_1_;
          in_stack_fffffffffffff2e7 = CStack_f0.comp_mv._3_1_;
          in_stack_fffffffffffff2e4 = CStack_f0.comp_mv._0_2_;
          if (local_128 == 0) {
            if (((*(int *)((long)local_40 + 0x60b14) == 0) ||
                (in_stack_00000018 == (TileDataEnc *)0x7fffffffffffffff)) ||
               (lVar6 = ((long)local_c8 >> 3) * 3,
               lVar6 - (long)in_stack_00000018 == 0 || lVar6 < (long)in_stack_00000018)) {
              if ((in_stack_00000010->plane[0].round_QTX != (int16_t *)0x0) &&
                 (local_9c.as_int != 0)) {
                bVar3 = compound_ref0_mode(local_9d);
                in_stack_fffffffffffff3a4 = (uint)bVar3;
                bVar3 = compound_ref1_mode(local_9d);
                in_stack_fffffffffffff3a0 = (uint)bVar3;
                if (*(long *)(in_stack_00000010->plane[0].round_QTX +
                             (long)(int)in_stack_fffffffffffff3a4 * 0x60 +
                             (long)local_b0c * 0x20 + (long)(int)local_b8.as_int * 4) <
                    *(long *)(in_stack_00000010->plane[0].round_QTX +
                             (long)(int)in_stack_fffffffffffff3a0 * 0x60 +
                             (long)local_b0c * 0x20 + (long)(int)local_b4.as_int * 4)) {
                  in_stack_fffffffffffff360 =
                       *(int_mv **)
                        (in_stack_00000010->plane[0].round_QTX +
                        (long)(int)in_stack_fffffffffffff3a4 * 0x60 +
                        (long)local_b0c * 0x20 + (long)(int)local_b8.as_int * 4);
                }
                else {
                  in_stack_fffffffffffff360 =
                       *(int_mv **)
                        (in_stack_00000010->plane[0].round_QTX +
                        (long)(int)in_stack_fffffffffffff3a0 * 0x60 +
                        (long)local_b0c * 0x20 + (long)(int)local_b4.as_int * 4);
                }
                lVar6 = ((long)local_c8 >> 3) * 6;
                in_stack_fffffffffffff398 = in_stack_fffffffffffff360;
                if ((lVar6 - (long)in_stack_fffffffffffff360 != 0 &&
                     (long)in_stack_fffffffffffff360 <= lVar6) &&
                   ((long)in_stack_00000018 < 0x7fffffffffffffff)) {
                  in_stack_fffffffffffff2f0 =
                       (MB_MODE_INFO_EXT *)CONCAT44(iStack_dc.as_int,iStack_e0.as_int);
                  iVar8 = local_e8.this_mv;
                  iVar10 = local_e8.comp_mv;
                  in_stack_fffffffffffff2e4 = CStack_f0.comp_mv._0_2_;
                  in_stack_fffffffffffff2e6 = CStack_f0.comp_mv._2_1_;
                  in_stack_fffffffffffff2e7 = CStack_f0.comp_mv._3_1_;
                  dst_01.plane[1]._0_4_ = CStack_f0.this_mv.as_int;
                  dst_01.plane[0] = (uint8_t *)local_120._40_8_;
                  dst_01.plane[1]._4_2_ = in_stack_fffffffffffff2e4;
                  dst_01.plane[1]._6_1_ = in_stack_fffffffffffff2e6;
                  dst_01.plane[1]._7_1_ = in_stack_fffffffffffff2e7;
                  dst_01.plane[2]._0_4_ = iVar8.as_int;
                  dst_01.plane[2]._4_4_ = iVar10.as_int;
                  dst_01.stride._0_8_ = in_stack_fffffffffffff2f0;
                  dst_01.stride[2] = local_d8.as_int;
                  dst_01._36_4_ = iStack_d4.as_int;
                  iVar7 = local_d8;
                  iVar9 = iStack_d4;
                  restore_dst_buf((MACROBLOCKD *)local_80,dst_01,local_74.as_int);
                  mbmi_01 = (int_mv *)CONCAT44(iVar9.as_int,iVar7.as_int);
                  mbmi_00 = (MB_MODE_INFO *)CONCAT44(iVar10.as_int,iVar8.as_int);
                  goto LAB_002cb9a1;
                }
              }
LAB_002cb518:
              uVar12 = (undefined4)((ulong)in_stack_fffffffffffff310 >> 0x20);
              *(int *)local_60 = local_b18 + *(int *)local_60;
              if (iVar5 != 1) {
                in_stack_fffffffffffff35c = CONCAT13(local_51,(int3)in_stack_fffffffffffff35c);
                in_stack_fffffffffffff340 = local_70;
                in_stack_fffffffffffff348 = local_80;
                uVar15 = in_stack_fffffffffffff3ac;
                av1_num_planes((AV1_COMMON *)local_70);
                av1_enc_build_inter_predictor
                          (in_stack_fffffffffffff330,
                           (MACROBLOCKD *)&in_stack_fffffffffffff328->as_mv,
                           in_stack_fffffffffffff324,in_stack_fffffffffffff320,
                           (BUFFER_SET *)in_stack_fffffffffffff318,
                           (BLOCK_SIZE)((uint)uVar12 >> 0x18),
                           in_stack_fffffffffffff340.this_mv.as_int,
                           in_stack_fffffffffffff348.this_mv.as_int);
                in_stack_fffffffffffff354 = uVar11;
                in_stack_fffffffffffff358 = in_stack_fffffffffffff3ac;
                in_stack_fffffffffffff3ac = uVar15;
              }
              in_stack_fffffffffffff394 = *(int *)local_60;
              in_stack_fffffffffffff330 =
                   (AV1_COMMON *)CONCAT17(in_stack_0000000f,in_stack_00000008);
              in_stack_fffffffffffff300 = (CANDIDATE_MV)((long)local_120 + 0x28);
              in_stack_fffffffffffff328 = (int_mv *)&stack0xfffffffffffff388;
              in_stack_fffffffffffff310 = (MACROBLOCK *)CONCAT44(uVar12,in_stack_00000038);
              in_stack_fffffffffffff320 = 0;
              in_stack_fffffffffffff308 = in_stack_00000030;
              in_stack_fffffffffffff318 = in_stack_00000040;
              in_stack_fffffffffffff338 = in_stack_fffffffffffff328;
              local_128 = motion_mode_rd(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                         in_stack_0000000f,unaff_retaddr,(RD_STATS *)unaff_RBP,
                                         (RD_STATS *)in_stack_00000040,in_stack_00000048,
                                         (int64_t)in_stack_00000050,in_stack_00000058,
                                         in_stack_00000060,in_stack_00000068,in_stack_00000070,
                                         in_stack_00000078,in_stack_00000080,in_stack_00000088,
                                         in_stack_00000090);
              if (local_128 != 0x7fffffffffffffff) {
                in_stack_fffffffffffff380 =
                     (TileDataEnc *)
                     (((long)*(int *)local_60 * (long)*(int *)((long)local_50 + 0x4218) + 0x100 >> 9
                      ) + *(int64_t *)((long)local_60 + 8) * 0x80);
                TVar4 = get_prediction_mode_idx
                                  (*(PREDICTION_MODE *)((long)local_88 + 2),
                                   *(MV_REFERENCE_FRAME *)((long)local_88 + 0x10),
                                   *(MV_REFERENCE_FRAME *)((long)local_88 + 0x11));
                in_stack_fffffffffffff300.comp_mv.as_int = 0;
                in_stack_fffffffffffff300.this_mv.as_int = in_stack_00000038;
                store_winner_mode_stats
                          ((AV1_COMMON *)&in_stack_fffffffffffff360->as_mv,
                           (MACROBLOCK *)
                           CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
                           (MB_MODE_INFO *)
                           CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                           (RD_STATS *)in_stack_fffffffffffff348,
                           (RD_STATS *)in_stack_fffffffffffff340,
                           (RD_STATS *)&in_stack_fffffffffffff338->as_mv,(THR_MODES)x_00,
                           (uint8_t *)CONCAT17(TVar4,CONCAT16(uVar14,in_stack_fffffffffffff378)),
                           (BLOCK_SIZE)in_stack_fffffffffffff380,(int64_t)in_stack_fffffffffffff388,
                           in_stack_fffffffffffff390,(int)in_stack_fffffffffffff398);
                if ((long)in_stack_fffffffffffff380 < (long)local_1b0) {
                  local_9c0 = in_stack_fffffffffffff388;
                  memcpy(local_158,(void *)local_60,0x28);
                  memcpy(local_180,(void *)local_68,0x28);
                  memcpy(local_1a8,(void *)CONCAT17(in_stack_0000000f,in_stack_00000008),0x28);
                  local_1b0 = in_stack_fffffffffffff380;
                  memcpy(local_a70,(void *)local_88,0xb0);
                  local_a74 = (uint)*(byte *)local_98;
                  memcpy(local_5b8,(byte *)((long)local_98 + 1),
                         (ulong)*(uint8_t *)((long)local_80 + 0x2075) *
                         (ulong)*(uint8_t *)((long)local_80 + 0x2074));
                  memcpy(local_9b8,*(uint8_t **)((long)local_80 + 0x1ee8),
                         (long)(int)((uint)*(uint8_t *)((long)local_80 + 0x2075) *
                                    (uint)*(uint8_t *)((long)local_80 + 0x2074)));
                  in_stack_00000048->interp_filter_stats[0].pred_sse = (uint)local_bc;
                  *(int *)&in_stack_00000048->interp_filter_stats[0].field_0x24 =
                       in_stack_fffffffffffff394;
                }
                if ((long)in_stack_fffffffffffff380 < (long)in_stack_00000018) {
                  local_aec = local_b0c;
                  in_stack_00000018 = in_stack_fffffffffffff380;
                }
              }
              in_stack_fffffffffffff2f0 =
                   (MB_MODE_INFO_EXT *)CONCAT44(iStack_dc.as_int,iStack_e0.as_int);
              iVar8 = local_e8.this_mv;
              iVar10 = local_e8.comp_mv;
              in_stack_fffffffffffff2e4 = CStack_f0.comp_mv._0_2_;
              in_stack_fffffffffffff2e6 = CStack_f0.comp_mv._2_1_;
              in_stack_fffffffffffff2e7 = CStack_f0.comp_mv._3_1_;
              dst_02.plane[1]._0_4_ = CStack_f0.this_mv.as_int;
              dst_02.plane[0] = (uint8_t *)local_120._40_8_;
              dst_02.plane[1]._4_2_ = in_stack_fffffffffffff2e4;
              dst_02.plane[1]._6_1_ = in_stack_fffffffffffff2e6;
              dst_02.plane[1]._7_1_ = in_stack_fffffffffffff2e7;
              dst_02.plane[2]._0_4_ = iVar8.as_int;
              dst_02.plane[2]._4_4_ = iVar10.as_int;
              dst_02.stride._0_8_ = in_stack_fffffffffffff2f0;
              dst_02.stride[2] = local_d8.as_int;
              dst_02._36_4_ = iStack_d4.as_int;
              iVar7 = local_d8;
              iVar9 = iStack_d4;
              restore_dst_buf((MACROBLOCKD *)local_80,dst_02,local_74.as_int);
              mbmi_01 = (int_mv *)CONCAT44(iVar9.as_int,iVar7.as_int);
              mbmi_00 = (MB_MODE_INFO *)CONCAT44(iVar10.as_int,iVar8.as_int);
            }
            else {
              in_stack_fffffffffffff2f0 =
                   (MB_MODE_INFO_EXT *)CONCAT44(iStack_dc.as_int,iStack_e0.as_int);
              dst_00.plane[1]._0_4_ = CStack_f0.this_mv.as_int;
              dst_00.plane[0] = (uint8_t *)local_120._40_8_;
              dst_00.plane[1]._4_2_ = in_stack_fffffffffffff2e4;
              dst_00.plane[1]._6_1_ = in_stack_fffffffffffff2e6;
              dst_00.plane[1]._7_1_ = in_stack_fffffffffffff2e7;
              dst_00.plane[2]._0_4_ = iVar7.as_int;
              dst_00.plane[2]._4_4_ = iVar9.as_int;
              dst_00.stride._0_8_ = in_stack_fffffffffffff2f0;
              dst_00.stride[2] = local_d8.as_int;
              dst_00._36_4_ = iStack_d4.as_int;
              iVar8 = local_d8;
              iVar10 = iStack_d4;
              restore_dst_buf((MACROBLOCKD *)local_80,dst_00,local_74.as_int);
              mbmi_01 = (int_mv *)CONCAT44(iVar10.as_int,iVar8.as_int);
              mbmi_00 = (MB_MODE_INFO *)CONCAT44(iVar9.as_int,iVar7.as_int);
            }
          }
          else {
            in_stack_fffffffffffff2f0 =
                 (MB_MODE_INFO_EXT *)CONCAT44(iStack_dc.as_int,iStack_e0.as_int);
            dst.plane[1]._0_4_ = CStack_f0.this_mv.as_int;
            dst.plane[0] = (uint8_t *)local_120._40_8_;
            dst.plane[1]._4_2_ = in_stack_fffffffffffff2e4;
            dst.plane[1]._6_1_ = in_stack_fffffffffffff2e6;
            dst.plane[1]._7_1_ = in_stack_fffffffffffff2e7;
            dst.plane[2]._0_4_ = iVar7.as_int;
            dst.plane[2]._4_4_ = iVar9.as_int;
            dst.stride._0_8_ = in_stack_fffffffffffff2f0;
            dst.stride[2] = local_d8.as_int;
            dst._36_4_ = iStack_d4.as_int;
            iVar8 = local_d8;
            iVar10 = iStack_d4;
            restore_dst_buf((MACROBLOCKD *)local_80,dst,local_74.as_int);
            mbmi_01 = (int_mv *)CONCAT44(iVar10.as_int,iVar8.as_int);
            mbmi_00 = (MB_MODE_INFO *)CONCAT44(iVar9.as_int,iVar7.as_int);
          }
        }
      }
    }
LAB_002cb9a1:
    local_b0c = local_b0c + 1;
  } while( true );
}

Assistant:

static int64_t handle_inter_mode(
    AV1_COMP *const cpi, TileDataEnc *tile_data, MACROBLOCK *x,
    BLOCK_SIZE bsize, RD_STATS *rd_stats, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats_uv, HandleInterModeArgs *args, int64_t ref_best_rd,
    uint8_t *const tmp_buf, const CompoundTypeRdBuffers *rd_buffers,
    int64_t *best_est_rd, const int do_tx_search,
    InterModesInfo *inter_modes_info, motion_mode_candidate *motion_mode_cand,
    int64_t *skip_rd, PruneInfoFromTpl *inter_cost_info_from_tpl,
    int64_t *yrd) {
  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;

#if CONFIG_REALTIME_ONLY
  const int prune_modes_based_on_tpl = 0;
#else   // CONFIG_REALTIME_ONLY
  const TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const int prune_modes_based_on_tpl =
      cpi->sf.inter_sf.prune_inter_modes_based_on_tpl &&
      av1_tpl_stats_ready(tpl_data, cpi->gf_frame_index);
#endif  // CONFIG_REALTIME_ONLY
  int i;
  // Reference frames for this mode
  const int refs[2] = { mbmi->ref_frame[0],
                        (mbmi->ref_frame[1] < 0 ? 0 : mbmi->ref_frame[1]) };
  int rate_mv = 0;
  int64_t rd = INT64_MAX;
  // Do first prediction into the destination buffer. Do the next
  // prediction into a temporary buffer. Then keep track of which one
  // of these currently holds the best predictor, and use the other
  // one for future predictions. In the end, copy from tmp_buf to
  // dst if necessary.
  struct macroblockd_plane *pd = xd->plane;
  const BUFFER_SET orig_dst = {
    { pd[0].dst.buf, pd[1].dst.buf, pd[2].dst.buf },
    { pd[0].dst.stride, pd[1].dst.stride, pd[2].dst.stride },
  };
  const BUFFER_SET tmp_dst = { { tmp_buf, tmp_buf + 1 * MAX_SB_SQUARE,
                                 tmp_buf + 2 * MAX_SB_SQUARE },
                               { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE } };

  int64_t ret_val = INT64_MAX;
  const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
  RD_STATS best_rd_stats, best_rd_stats_y, best_rd_stats_uv;
  int64_t best_rd = INT64_MAX;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  int64_t best_yrd = INT64_MAX;
  MB_MODE_INFO best_mbmi = *mbmi;
  int best_xskip_txfm = 0;
  int64_t newmv_ret_val = INT64_MAX;
  inter_mode_info mode_info[MAX_REF_MV_SEARCH];

  // Do not prune the mode based on inter cost from tpl if the current ref frame
  // is the winner ref in neighbouring blocks.
  int ref_match_found_in_above_nb = 0;
  int ref_match_found_in_left_nb = 0;
  if (prune_modes_based_on_tpl) {
    ref_match_found_in_above_nb =
        find_ref_match_in_above_nbs(cm->mi_params.mi_cols, xd);
    ref_match_found_in_left_nb =
        find_ref_match_in_left_nbs(cm->mi_params.mi_rows, xd);
  }

  // First, perform a simple translation search for each of the indices. If
  // an index performs well, it will be fully searched in the main loop
  // of this function.
  const int ref_set = get_drl_refmv_count(x, mbmi->ref_frame, this_mode);
  // Save MV results from first 2 ref_mv_idx.
  int_mv save_mv[MAX_REF_MV_SEARCH - 1][2];
  int best_ref_mv_idx = -1;
  const int idx_mask =
      ref_mv_idx_to_search(cpi, x, rd_stats, args, ref_best_rd, bsize, ref_set);
  const int16_t mode_ctx =
      av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);
  const ModeCosts *mode_costs = &x->mode_costs;
  const int ref_mv_cost = cost_mv_ref(mode_costs, this_mode, mode_ctx);
  const int base_rate =
      args->ref_frame_cost + args->single_comp_cost + ref_mv_cost;

  for (i = 0; i < MAX_REF_MV_SEARCH - 1; ++i) {
    save_mv[i][0].as_int = INVALID_MV;
    save_mv[i][1].as_int = INVALID_MV;
  }
  args->start_mv_cnt = 0;

  // Main loop of this function. This will  iterate over all of the ref mvs
  // in the dynamic reference list and do the following:
  //    1.) Get the current MV. Create newmv MV if necessary
  //    2.) Search compound type and parameters if applicable
  //    3.) Do interpolation filter search
  //    4.) Build the inter predictor
  //    5.) Pick the motion mode (SIMPLE_TRANSLATION, OBMC_CAUSAL,
  //        WARPED_CAUSAL)
  //    6.) Update stats if best so far
  for (int ref_mv_idx = 0; ref_mv_idx < ref_set; ++ref_mv_idx) {
    mbmi->ref_mv_idx = ref_mv_idx;

    mode_info[ref_mv_idx].full_search_mv.as_int = INVALID_MV;
    mode_info[ref_mv_idx].full_mv_bestsme = INT_MAX;
    const int drl_cost = get_drl_cost(
        mbmi, mbmi_ext, mode_costs->drl_mode_cost0, ref_frame_type);
    mode_info[ref_mv_idx].drl_cost = drl_cost;
    mode_info[ref_mv_idx].skip = 0;

    if (!mask_check_bit(idx_mask, ref_mv_idx)) {
      // MV did not perform well in simple translation search. Skip it.
      continue;
    }
    if (prune_modes_based_on_tpl && !ref_match_found_in_above_nb &&
        !ref_match_found_in_left_nb && (ref_best_rd != INT64_MAX)) {
      // Skip mode if TPL model indicates it will not be beneficial.
      if (prune_modes_based_on_tpl_stats(
              inter_cost_info_from_tpl, refs, ref_mv_idx, this_mode,
              cpi->sf.inter_sf.prune_inter_modes_based_on_tpl))
        continue;
    }
    av1_init_rd_stats(rd_stats);

    // Initialize compound mode data
    mbmi->interinter_comp.type = COMPOUND_AVERAGE;
    mbmi->comp_group_idx = 0;
    mbmi->compound_idx = 1;
    if (mbmi->ref_frame[1] == INTRA_FRAME) mbmi->ref_frame[1] = NONE_FRAME;

    mbmi->num_proj_ref = 0;
    mbmi->motion_mode = SIMPLE_TRANSLATION;

    // Compute cost for signalling this DRL index
    rd_stats->rate = base_rate;
    rd_stats->rate += drl_cost;

    int rs = 0;
    int compmode_interinter_cost = 0;

    int_mv cur_mv[2];

    // TODO(Cherma): Extend this speed feature to support compound mode
    int skip_repeated_ref_mv =
        is_comp_pred ? 0 : cpi->sf.inter_sf.skip_repeated_ref_mv;
    // Generate the current mv according to the prediction mode
    if (!build_cur_mv(cur_mv, this_mode, cm, x, skip_repeated_ref_mv)) {
      continue;
    }

    // The above call to build_cur_mv does not handle NEWMV modes. Build
    // the mv here if we have NEWMV for any predictors.
    if (have_newmv_in_inter_mode(this_mode)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
      start_timing(cpi, handle_newmv_time);
#endif
      newmv_ret_val =
          handle_newmv(cpi, x, bsize, cur_mv, &rate_mv, args, mode_info);
#if CONFIG_COLLECT_COMPONENT_TIMING
      end_timing(cpi, handle_newmv_time);
#endif

      if (newmv_ret_val != 0) continue;

      if (is_inter_singleref_mode(this_mode) &&
          cur_mv[0].as_int != INVALID_MV) {
        const MV_REFERENCE_FRAME ref = refs[0];
        const unsigned int this_sse = x->pred_sse[ref];
        if (this_sse < args->best_single_sse_in_refs[ref]) {
          args->best_single_sse_in_refs[ref] = this_sse;
        }

        if (cpi->sf.rt_sf.skip_newmv_mode_based_on_sse) {
          const int th_idx = cpi->sf.rt_sf.skip_newmv_mode_based_on_sse - 1;
          const int pix_idx = num_pels_log2_lookup[bsize] - 4;
          const double scale_factor[3][11] = {
            { 0.7, 0.7, 0.7, 0.7, 0.7, 0.8, 0.8, 0.9, 0.9, 0.9, 0.9 },
            { 0.7, 0.7, 0.7, 0.7, 0.8, 0.8, 1, 1, 1, 1, 1 },
            { 0.7, 0.7, 0.7, 0.7, 1, 1, 1, 1, 1, 1, 1 }
          };
          assert(pix_idx >= 0);
          assert(th_idx <= 2);
          if (args->best_pred_sse < scale_factor[th_idx][pix_idx] * this_sse)
            continue;
        }
      }

      rd_stats->rate += rate_mv;
    }
    // Copy the motion vector for this mode into mbmi struct
    for (i = 0; i < is_comp_pred + 1; ++i) {
      mbmi->mv[i].as_int = cur_mv[i].as_int;
    }

    if (RDCOST(x->rdmult, rd_stats->rate, 0) > ref_best_rd &&
        mbmi->mode != NEARESTMV && mbmi->mode != NEAREST_NEARESTMV) {
      continue;
    }

    // Skip the rest of the search if prune_ref_mv_idx_search speed feature
    // is enabled, and the current MV is similar to a previous one.
    if (cpi->sf.inter_sf.prune_ref_mv_idx_search && is_comp_pred &&
        prune_ref_mv_idx_search(ref_mv_idx, best_ref_mv_idx, save_mv, mbmi,
                                cpi->sf.inter_sf.prune_ref_mv_idx_search))
      continue;

    if (cpi->sf.gm_sf.prune_zero_mv_with_sse &&
        (this_mode == GLOBALMV || this_mode == GLOBAL_GLOBALMV)) {
      if (prune_zero_mv_with_sse(cpi->ppi->fn_ptr, x, bsize, args,
                                 cpi->sf.gm_sf.prune_zero_mv_with_sse)) {
        continue;
      }
    }

    int skip_build_pred = 0;
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;

    // Handle a compound predictor, continue if it is determined this
    // cannot be the best compound mode
    if (is_comp_pred) {
#if CONFIG_COLLECT_COMPONENT_TIMING
      start_timing(cpi, compound_type_rd_time);
#endif
      const int not_best_mode = process_compound_inter_mode(
          cpi, x, args, ref_best_rd, cur_mv, bsize, &compmode_interinter_cost,
          rd_buffers, &orig_dst, &tmp_dst, &rate_mv, rd_stats, skip_rd,
          &skip_build_pred);
#if CONFIG_COLLECT_COMPONENT_TIMING
      end_timing(cpi, compound_type_rd_time);
#endif
      if (not_best_mode) continue;
    }

    if (!args->skip_ifs) {
#if CONFIG_COLLECT_COMPONENT_TIMING
      start_timing(cpi, interpolation_filter_search_time);
#endif
      // Determine the interpolation filter for this mode
      ret_val = av1_interpolation_filter_search(
          x, cpi, tile_data, bsize, &tmp_dst, &orig_dst, &rd, &rs,
          &skip_build_pred, args, ref_best_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
      end_timing(cpi, interpolation_filter_search_time);
#endif
      if (args->modelled_rd != NULL && !is_comp_pred) {
        args->modelled_rd[this_mode][ref_mv_idx][refs[0]] = rd;
      }
      if (ret_val != 0) {
        restore_dst_buf(xd, orig_dst, num_planes);
        continue;
      } else if (cpi->sf.inter_sf.model_based_post_interp_filter_breakout &&
                 ref_best_rd != INT64_MAX && (rd >> 3) * 3 > ref_best_rd) {
        restore_dst_buf(xd, orig_dst, num_planes);
        continue;
      }

      // Compute modelled RD if enabled
      if (args->modelled_rd != NULL) {
        if (is_comp_pred) {
          const int mode0 = compound_ref0_mode(this_mode);
          const int mode1 = compound_ref1_mode(this_mode);
          const int64_t mrd =
              AOMMIN(args->modelled_rd[mode0][ref_mv_idx][refs[0]],
                     args->modelled_rd[mode1][ref_mv_idx][refs[1]]);
          if ((rd >> 3) * 6 > mrd && ref_best_rd < INT64_MAX) {
            restore_dst_buf(xd, orig_dst, num_planes);
            continue;
          }
        }
      }
    }

    rd_stats->rate += compmode_interinter_cost;
    if (skip_build_pred != 1) {
      // Build this inter predictor if it has not been previously built
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst, bsize, 0,
                                    av1_num_planes(cm) - 1);
    }

#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, motion_mode_rd_time);
#endif
    int rate2_nocoeff = rd_stats->rate;
    // Determine the motion mode. This will be one of SIMPLE_TRANSLATION,
    // OBMC_CAUSAL or WARPED_CAUSAL
    int64_t this_yrd;
    ret_val = motion_mode_rd(cpi, tile_data, x, bsize, rd_stats, rd_stats_y,
                             rd_stats_uv, args, ref_best_rd, skip_rd, &rate_mv,
                             &orig_dst, best_est_rd, do_tx_search,
                             inter_modes_info, 0, &this_yrd);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, motion_mode_rd_time);
#endif
    assert(
        IMPLIES(!av1_check_newmv_joint_nonzero(cm, x), ret_val == INT64_MAX));

    if (ret_val != INT64_MAX) {
      int64_t tmp_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      const THR_MODES mode_enum = get_prediction_mode_idx(
          mbmi->mode, mbmi->ref_frame[0], mbmi->ref_frame[1]);
      // Collect mode stats for multiwinner mode processing
      store_winner_mode_stats(&cpi->common, x, mbmi, rd_stats, rd_stats_y,
                              rd_stats_uv, mode_enum, NULL, bsize, tmp_rd,
                              cpi->sf.winner_mode_sf.multi_winner_mode_type,
                              do_tx_search);
      if (tmp_rd < best_rd) {
        best_yrd = this_yrd;
        // Update the best rd stats if we found the best mode so far
        best_rd_stats = *rd_stats;
        best_rd_stats_y = *rd_stats_y;
        best_rd_stats_uv = *rd_stats_uv;
        best_rd = tmp_rd;
        best_mbmi = *mbmi;
        best_xskip_txfm = txfm_info->skip_txfm;
        memcpy(best_blk_skip, txfm_info->blk_skip,
               sizeof(best_blk_skip[0]) * xd->height * xd->width);
        av1_copy_array(best_tx_type_map, xd->tx_type_map,
                       xd->height * xd->width);
        motion_mode_cand->rate_mv = rate_mv;
        motion_mode_cand->rate2_nocoeff = rate2_nocoeff;
      }

      if (tmp_rd < ref_best_rd) {
        ref_best_rd = tmp_rd;
        best_ref_mv_idx = ref_mv_idx;
      }
    }
    restore_dst_buf(xd, orig_dst, num_planes);
  }

  if (best_rd == INT64_MAX) return INT64_MAX;

  // re-instate status of the best choice
  *rd_stats = best_rd_stats;
  *rd_stats_y = best_rd_stats_y;
  *rd_stats_uv = best_rd_stats_uv;
  *yrd = best_yrd;
  *mbmi = best_mbmi;
  txfm_info->skip_txfm = best_xskip_txfm;
  assert(IMPLIES(mbmi->comp_group_idx == 1,
                 mbmi->interinter_comp.type != COMPOUND_AVERAGE));
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, xd->height * xd->width);

  rd_stats->rdcost = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);

  return rd_stats->rdcost;
}